

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

TxSize wallet::CalculateMaximumSignedTxSize
                 (CTransaction *tx,CWallet *wallet,vector<CTxOut,_std::allocator<CTxOut>_> *txouts,
                 CCoinControl *coin_control)

{
  long lVar1;
  TxSize TVar2;
  anon_class_16_2_2b2fa62f_for__M_pred __pred;
  undefined1 uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  const_iterator cVar7;
  size_t sVar8;
  ulong uVar9;
  size_type sVar10;
  long *plVar11;
  CCoinControl *in_RDX;
  int64_t in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  uint32_t i;
  CTxOut *txo;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1;
  bool is_segwit;
  int64_t weight;
  const_iterator __end1;
  const_iterator __begin1;
  optional<long> txin_weight;
  CWallet *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  int64_t in_stack_ffffffffffffff38;
  CWallet **in_stack_ffffffffffffff40;
  CCoinControl **in_stack_ffffffffffffff48;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  in_stack_ffffffffffffff50;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
  in_stack_ffffffffffffff58;
  uint local_9c;
  undefined7 in_stack_ffffffffffffff98;
  int64_t local_48;
  CTxIn *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::size
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff18);
  uVar5 = GetSizeOfCompactSize(CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::size
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff18);
  uVar6 = GetSizeOfCompactSize(CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  local_40 = (CTxIn *)(ulong)((uVar5 + 8 + uVar6) * 4);
  cVar7 = std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  __pred.coin_control = in_stack_ffffffffffffff48;
  __pred.wallet = in_stack_ffffffffffffff40;
  uVar3 = std::
          any_of<__gnu_cxx::__normal_iterator<CTxOut_const*,std::vector<CTxOut,std::allocator<CTxOut>>>,wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,__pred);
  if ((bool)uVar3) {
    local_40 = (CTxIn *)((local_40->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        2);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  while( true ) {
    bVar4 = __gnu_cxx::operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_ffffffffffffff28,
                       (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
              in_stack_ffffffffffffff18);
    sVar8 = GetSerializeSize<CTxOut>
                      ((CTxOut *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_40 = (CTxIn *)((local_40->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        sVar8 * 4);
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
               in_stack_ffffffffffffff18);
  }
  local_9c = 0;
  do {
    uVar9 = (ulong)local_9c;
    sVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff18);
    if (sVar10 <= uVar9) {
      local_48 = GetVirtualTransactionSize
                           (in_stack_ffffffffffffff38,(int64_t)in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff24);
LAB_00a84f40:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        TVar2.weight = (int64_t)local_40;
        TVar2.vsize = local_48;
        return TVar2;
      }
      __stack_chk_fail();
    }
    in_stack_ffffffffffffff38 = in_RSI;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              (in_stack_ffffffffffffff28,
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff28,
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    CWallet::CanGrindR(in_stack_ffffffffffffff18);
    GetSignedTxinWeight(in_RDI,in_RDX,local_40,(CTxOut *)CONCAT17(uVar3,in_stack_ffffffffffffff98),
                        SUB81((ulong)cVar7._M_current >> 0x38,0),
                        SUB81((ulong)cVar7._M_current >> 0x30,0));
    bVar4 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffff18);
    if (!bVar4) {
      local_48 = -1;
      local_40 = (CTxIn *)0xffffffffffffffff;
      goto LAB_00a84f40;
    }
    plVar11 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff18);
    if (*plVar11 < 0) {
      __assert_fail("*txin_weight > -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                    ,0x9e,
                    "TxSize wallet::CalculateMaximumSignedTxSize(const CTransaction &, const CWallet *, const std::vector<CTxOut> &, const CCoinControl *)"
                   );
    }
    plVar11 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff18);
    local_40 = (CTxIn *)((local_40->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        *plVar11);
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

TxSize CalculateMaximumSignedTxSize(const CTransaction &tx, const CWallet *wallet, const std::vector<CTxOut>& txouts, const CCoinControl* coin_control)
{
    // version + nLockTime + input count + output count
    int64_t weight = (4 + 4 + GetSizeOfCompactSize(tx.vin.size()) + GetSizeOfCompactSize(tx.vout.size())) * WITNESS_SCALE_FACTOR;
    // Whether any input spends a witness program. Necessary to run before the next loop over the
    // inputs in order to accurately compute the compactSize length for the witness data per input.
    bool is_segwit = std::any_of(txouts.begin(), txouts.end(), [&](const CTxOut& txo) {
        std::unique_ptr<Descriptor> desc{GetDescriptor(wallet, coin_control, txo.scriptPubKey)};
        if (desc) return IsSegwit(*desc);
        return false;
    });
    // Segwit marker and flag
    if (is_segwit) weight += 2;

    // Add the size of the transaction outputs.
    for (const auto& txo : tx.vout) weight += GetSerializeSize(txo) * WITNESS_SCALE_FACTOR;

    // Add the size of the transaction inputs as if they were signed.
    for (uint32_t i = 0; i < txouts.size(); i++) {
        const auto txin_weight = GetSignedTxinWeight(wallet, coin_control, tx.vin[i], txouts[i], is_segwit, wallet->CanGrindR());
        if (!txin_weight) return TxSize{-1, -1};
        assert(*txin_weight > -1);
        weight += *txin_weight;
    }

    // It's ok to use 0 as the number of sigops since we never create any pathological transaction.
    return TxSize{GetVirtualTransactionSize(weight, 0, 0), weight};
}